

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> * __thiscall
fmt::v10::detail::make_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>,long_double>
          (basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>
           *__return_storage_ptr__,detail *this,longdouble *val)

{
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *arg;
  longdouble *val_local;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  longlong local_58;
  size_t sStack_50;
  
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>::basic_format_arg
            (__return_storage_ptr__);
  __return_storage_ptr__->type_ = last_numeric_type;
  (__return_storage_ptr__->value_).field_0.long_long_value = local_58;
  (__return_storage_ptr__->value_).field_0.string.size = sStack_50;
  return __return_storage_ptr__;
}

Assistant:

FMT_CONSTEXPR auto make_arg(T& val) -> basic_format_arg<Context> {
  auto arg = basic_format_arg<Context>();
  arg.type_ = mapped_type_constant<T, Context>::value;
  arg.value_ = make_arg<true, Context>(val);
  return arg;
}